

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O2

void enqueue(int **q,int e)

{
  int *__ptr;
  int iVar1;
  
  __ptr = *q;
  iVar1 = __ptr[1];
  if (*__ptr == iVar1) {
    iVar1 = *__ptr * 2 + 2;
    __ptr = (int *)realloc(__ptr,(long)iVar1 * 4);
    *q = __ptr;
    *__ptr = iVar1;
    iVar1 = __ptr[1];
  }
  __ptr[1] = iVar1 + 1;
  __ptr[iVar1] = e;
  return;
}

Assistant:

static inline void enqueue(int **q, int e)
{
  int _qsize;
  if ((*q)[0]==(*q)[1]) { 
    _qsize=2*((*q)[0]+1);
    (*q)=(int*)realloc((*q), _qsize*sizeof(int));
    (*q)[0]=_qsize;
  }
  (*q)[(*q)[1]++]=e;
}